

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_cursor.hpp
# Opt level: O2

void __thiscall
jsoncons::bson::basic_bson_cursor<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
basic_bson_cursor<jsoncons::stream_source<unsigned_char>>
          (basic_bson_cursor<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *this,
          stream_source<unsigned_char> *source,bson_decode_options *options,allocator<char> *alloc)

{
  char cVar1;
  
  *(undefined8 *)this = 0x998998;
  *(undefined8 *)(this + 0x2a0) = 0x998a38;
  basic_bson_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
  basic_bson_parser<jsoncons::stream_source<unsigned_char>>
            ((basic_bson_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *)
             (this + 8),source,options,alloc);
  *(undefined ***)(this + 0x238) = &PTR__basic_json_visitor_00998270;
  *(undefined2 *)(this + 0x240) = 3;
  *(undefined4 *)(this + 0x268) = 0;
  *(undefined8 *)(this + 0x248) = 0;
  *(undefined8 *)(this + 0x250) = 0;
  *(undefined8 *)(this + 0x254) = 0;
  *(undefined8 *)(this + 0x25c) = 0;
  *(undefined8 *)(this + 0x270) = 0;
  *(undefined8 *)(this + 0x278) = 0;
  *(undefined8 *)(this + 0x280) = 0;
  *(undefined8 *)(this + 0x288) = 0;
  *(undefined8 *)(this + 0x289) = 0;
  *(undefined8 *)(this + 0x291) = 0;
  this[0x12] = (basic_bson_cursor<jsoncons::stream_source<unsigned_char>,std::allocator<char>>)0x1;
  cVar1 = (**(code **)(*(long *)this + 0x18))(this);
  if (cVar1 == '\0') {
    (**(code **)(*(long *)this + 0x38))(this);
  }
  return;
}

Assistant:

basic_bson_cursor(Sourceable&& source,
        const bson_decode_options& options = bson_decode_options(),
        const Allocator& alloc = Allocator())
        : parser_(std::forward<Sourceable>(source), options, alloc)
    {
        parser_.cursor_mode(true);
        if (!done())
        {
            next();
        }
    }